

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall crnd::crn_unpacker::decode_alpha_selectors(crn_unpacker *this)

{
  symbol_codec *this_00;
  crn_header *pcVar1;
  unsigned_short *puVar2;
  bool bVar3;
  ushort uVar4;
  uint32 i;
  uint32 uVar5;
  uint8 *puVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  static_huffman_data_model dm;
  uint8 dxt5_from_linear [64];
  static_huffman_data_model local_a0;
  byte abStack_78 [72];
  
  this_00 = &this->m_codec;
  pcVar1 = this->m_pHeader;
  uVar9 = (uint)(pcVar1->m_alpha_selectors).m_size.m_buf[2] |
          (uint)(pcVar1->m_alpha_selectors).m_size.m_buf[1] << 8 |
          (uint)(pcVar1->m_alpha_selectors).m_size.m_buf[0] << 0x10;
  if (uVar9 != 0) {
    puVar6 = this->m_pData +
             ((ulong)(pcVar1->m_alpha_selectors).m_ofs.m_buf[2] |
             (ulong)((uint)(pcVar1->m_alpha_selectors).m_ofs.m_buf[0] << 0x10 |
                    (uint)(pcVar1->m_alpha_selectors).m_ofs.m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar6;
    (this->m_codec).m_pDecode_buf_next = puVar6;
    (this->m_codec).m_decode_buf_size = uVar9;
    (this->m_codec).m_pDecode_buf_end = puVar6 + uVar9;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
  }
  local_a0.m_total_syms = 0;
  local_a0.m_code_sizes.m_p = (uchar *)0x0;
  local_a0.m_code_sizes.m_size = 0;
  local_a0.m_code_sizes.m_capacity = 0;
  local_a0.m_code_sizes.m_alloc_failed = false;
  local_a0.m_pDecode_tables = (decoder_tables *)0x0;
  symbol_codec::decode_receive_static_data_model(this_00,&local_a0);
  uVar4 = *(ushort *)(this->m_pHeader->m_alpha_selectors).m_num.m_buf;
  uVar4 = uVar4 << 8 | uVar4 >> 8;
  uVar10 = (uint)uVar4 + (uint)uVar4 * 2;
  uVar9 = (this->m_alpha_selectors).m_size;
  if (uVar9 != uVar10) {
    if (uVar9 <= uVar10) {
      if ((this->m_alpha_selectors).m_capacity < uVar10) {
        bVar3 = elemental_vector::increase_capacity
                          ((elemental_vector *)&this->m_alpha_selectors,uVar10,uVar9 + 1 == uVar10,2
                           ,(object_mover)0x0);
        if (!bVar3) {
          (this->m_alpha_selectors).m_alloc_failed = true;
          goto LAB_001142cb;
        }
        uVar9 = (this->m_alpha_selectors).m_size;
      }
      memset((this->m_alpha_selectors).m_p + uVar9,0,(ulong)(uVar10 - uVar9) * 2);
    }
    (this->m_alpha_selectors).m_size = uVar10;
  }
LAB_001142cb:
  uVar7 = 0;
  do {
    abStack_78[uVar7] =
         *(char *)((long)&g_dxt5_from_linear + (uVar7 >> 3 & 0x1fffffff)) << 3 |
         *(byte *)((long)&g_dxt5_from_linear + (ulong)((uint)uVar7 & 7));
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x40);
  if ((this->m_alpha_selectors).m_size != 0) {
    uVar7 = 0;
    uVar10 = 0;
    uVar9 = 0;
    do {
      uVar11 = 0xfffffffa;
      uVar13 = 0;
      do {
        uVar11 = uVar11 + 6;
        uVar5 = symbol_codec::decode(this_00,&local_a0);
        bVar8 = (byte)uVar11;
        uVar9 = uVar9 ^ uVar5 << (bVar8 & 0x1f);
        uVar13 = uVar13 | (uint)abStack_78[uVar9 >> (bVar8 & 0x1f) & 0x3f] << (bVar8 & 0x1f);
      } while (uVar11 < 0x12);
      uVar14 = 0;
      uVar11 = 0xfffffffa;
      do {
        uVar11 = uVar11 + 6;
        uVar5 = symbol_codec::decode(this_00,&local_a0);
        bVar8 = (byte)uVar11;
        uVar10 = uVar10 ^ uVar5 << (bVar8 & 0x1f);
        uVar14 = uVar14 | (uint)abStack_78[uVar10 >> (bVar8 & 0x1f) & 0x3f] << (bVar8 & 0x1f);
      } while (uVar11 < 0x12);
      puVar2 = (this->m_alpha_selectors).m_p;
      iVar12 = (int)uVar7;
      puVar2[uVar7] = (unsigned_short)uVar13;
      puVar2[uVar7 + 1] = (ushort)(uVar14 << 8) | (ushort)(uVar13 >> 0x10);
      uVar11 = iVar12 + 3;
      uVar7 = (ulong)uVar11;
      puVar2[iVar12 + 2] = (unsigned_short)(uVar14 >> 8);
    } while (uVar11 < (this->m_alpha_selectors).m_size);
  }
  static_huffman_data_model::~static_huffman_data_model(&local_a0);
  return true;
}

Assistant:

bool decode_alpha_selectors()
        {
            m_codec.start_decoding(m_pData + m_pHeader->m_alpha_selectors.m_ofs, m_pHeader->m_alpha_selectors.m_size);
            static_huffman_data_model dm;
            m_codec.decode_receive_static_data_model(dm);
            m_alpha_selectors.resize(m_pHeader->m_alpha_selectors.m_num * 3);
            uint8 dxt5_from_linear[64];
            for (uint32 i = 0; i < 64; i++)
                dxt5_from_linear[i] = g_dxt5_from_linear[i & 7] | g_dxt5_from_linear[i >> 3] << 3;
            for (uint32 s0_linear = 0, s1_linear = 0, i = 0; i < m_alpha_selectors.size();)
            {
                uint32 s0 = 0, s1 = 0;
                for (uint32 j = 0; j < 24; s0 |= dxt5_from_linear[s0_linear >> j & 0x3F] << j, j += 6)
                    s0_linear ^= m_codec.decode(dm) << j;
                for (uint32 j = 0; j < 24; s1 |= dxt5_from_linear[s1_linear >> j & 0x3F] << j, j += 6)
                    s1_linear ^= m_codec.decode(dm) << j;
                m_alpha_selectors[i++] = s0;
                m_alpha_selectors[i++] = s0 >> 16 | s1 << 8;
                m_alpha_selectors[i++] = s1 >> 8;
            }
            m_codec.stop_decoding();
            return true;
        }